

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *path;
  w_status wVar1;
  uint uVar2;
  size_t size;
  w_file file;
  void *buf;
  w_alloc alloc;
  w_linear_alloc linear_alloc;
  size_t local_68;
  w_file local_60;
  void *local_58;
  w_alloc local_50;
  w_linear_alloc local_30;
  
  if (argc < 2) {
    uVar2 = 0;
    wp_log(W_LOG_LVL_WARNING,
           "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/cli/main.c"
           ,0x49,"no input files\n");
  }
  else {
    wVar1 = w_linear_alloc_create(&local_30,0x1000);
    uVar2 = 1;
    if (wVar1 == W_SUCCESS) {
      w_linear_alloc_get_universal_alloc(&local_50,&local_30);
      path = argv[1];
      if (path == (char *)0x0) {
        w_handle_failed_assertion
                  ("path != NULL","w_run",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/cli/main.c"
                   ,0x16);
      }
      wVar1 = w_file_open(&local_60,path);
      uVar2 = 1;
      if (wVar1 == W_SUCCESS) {
        wVar1 = w_file_read(&local_60,(void *)0x0,&local_68);
        if (wVar1 == W_SUCCESS) {
          wVar1 = (*local_50.allocate)(local_50.inst,&local_58,local_68,8);
          if (wVar1 == W_SUCCESS) {
            wVar1 = w_file_read(&local_60,local_58,&local_68);
            uVar2 = 1;
            if (wVar1 == W_SUCCESS) {
              wVar1 = w_file_close(&local_60);
              uVar2 = (uint)(wVar1 != W_SUCCESS);
            }
            (*local_50.free)(local_50.inst,local_58,local_68,8);
          }
        }
      }
      w_linear_alloc_destroy(&local_30);
    }
  }
  return uVar2;
}

Assistant:

int
main(
    int argc,
    const char **argv
)
{
    enum w_status status;
    struct w_alloc alloc;
    struct w_linear_alloc linear_alloc;

    if (argc < 2)
    {
        W_LOG_WARNING("no input files\n");
        return EXIT_SUCCESS;
    }

    status = w_linear_alloc_create(&linear_alloc, 4096);
    if (status != W_SUCCESS)
    {
        goto exit;
    }

    w_linear_alloc_get_universal_alloc(&alloc, &linear_alloc);

    status = w_run(&alloc, argv[1]);
    if (status != W_SUCCESS)
    {
        goto linear_alloc_cleanup;
    }

linear_alloc_cleanup:
    w_linear_alloc_destroy(&linear_alloc);

exit:
    return status == W_SUCCESS ? EXIT_SUCCESS : EXIT_FAILURE;
}